

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iomapper.cpp
# Opt level: O0

bool __thiscall
glslang::TSymbolValidater::typeCheck
          (TSymbolValidater *this,TType *type1,TType *type2,string *name,bool isBlock)

{
  TInfoSink *pTVar1;
  TType *type1_00;
  bool bVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_> *this_00;
  size_type sVar6;
  const_reference pvVar7;
  size_type sVar8;
  char *pcVar9;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  bool local_111;
  undefined1 local_d8 [8];
  string errorStr_2;
  string errorStr_1;
  string errorStr;
  size_t index;
  size_t index2;
  size_t memberCount;
  string newName;
  TTypeList *typeList2;
  TTypeList *typeList1;
  bool hasError;
  bool isBlock_local;
  string *name_local;
  TType *type2_local;
  TType *type1_local;
  TSymbolValidater *this_local;
  
  typeList1._6_1_ = false;
  uVar3 = (*type1->_vptr_TType[0x25])();
  if (((uVar3 & 1) == 0) || (uVar3 = (*type2->_vptr_TType[0x25])(), (uVar3 & 1) == 0)) {
    bVar2 = qualifierCheck(this,type1,type2,name,isBlock);
    return bVar2;
  }
  iVar4 = (*type1->_vptr_TType[7])();
  typeList1._7_1_ = isBlock;
  if ((iVar4 == 0x10) && (iVar4 = (*type2->_vptr_TType[7])(), iVar4 == 0x10)) {
    typeList1._7_1_ = 1;
  }
  this_00 = &TType::getStruct(type1)->
             super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>;
  newName.field_2._8_8_ = TType::getStruct(type2);
  std::__cxx11::string::string((string *)&memberCount,(string *)name);
  sVar6 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::size(this_00)
  ;
  index = 0;
  for (errorStr.field_2._8_8_ = 0; (ulong)errorStr.field_2._8_8_ < sVar6;
      errorStr.field_2._8_8_ = errorStr.field_2._8_8_ + 1) {
    pvVar7 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::at
                       (this_00,errorStr.field_2._8_8_);
    iVar4 = (*pvVar7->type->_vptr_TType[7])();
    if (iVar4 != 0) {
      while( true ) {
        sVar8 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::size
                          ((vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_> *
                           )newName.field_2._8_8_);
        bVar2 = false;
        if (index < sVar8) {
          pvVar7 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::at
                             ((vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                               *)newName.field_2._8_8_,index);
          iVar4 = (*pvVar7->type->_vptr_TType[7])();
          bVar2 = iVar4 == 0;
        }
        if (!bVar2) break;
        index = index + 1;
      }
      sVar8 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::size
                        ((vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_> *)
                         newName.field_2._8_8_);
      if (index == sVar8) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&errorStr_1.field_2 + 8),name,": struct mismatch.");
        pTVar1 = this->infoSink;
        pcVar9 = (char *)std::__cxx11::string::c_str();
        TInfoSinkBase::message(&pTVar1->info,EPrefixError,pcVar9);
        typeList1._6_1_ = true;
        std::__cxx11::string::~string((string *)(errorStr_1.field_2._M_local_buf + 8));
        break;
      }
      pvVar7 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::at
                         (this_00,errorStr.field_2._8_8_);
      iVar4 = (*pvVar7->type->_vptr_TType[6])();
      pvVar7 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::at
                         ((vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_> *)
                          newName.field_2._8_8_,index);
      iVar5 = (*pvVar7->type->_vptr_TType[6])();
      bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                               *)CONCAT44(extraout_var,iVar4),
                              (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                               *)CONCAT44(extraout_var_00,iVar5));
      if (bVar2) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&errorStr_2.field_2 + 8),name,": member name mismatch.");
        pTVar1 = this->infoSink;
        pcVar9 = (char *)std::__cxx11::string::c_str();
        TInfoSinkBase::message(&pTVar1->info,EPrefixError,pcVar9);
        typeList1._6_1_ = true;
        std::__cxx11::string::~string((string *)(errorStr_2.field_2._M_local_buf + 8));
      }
      else {
        pvVar7 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::at
                           (this_00,errorStr.field_2._8_8_);
        iVar4 = (*pvVar7->type->_vptr_TType[6])();
        pcVar9 = std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                           ((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                             *)CONCAT44(extraout_var_01,iVar4));
        std::__cxx11::string::operator=((string *)&memberCount,pcVar9);
      }
      local_111 = true;
      if (typeList1._6_1_ == false) {
        pvVar7 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::at
                           (this_00,errorStr.field_2._8_8_);
        type1_00 = pvVar7->type;
        pvVar7 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::at
                           ((vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                             *)newName.field_2._8_8_,index);
        local_111 = typeCheck(this,type1_00,pvVar7->type,(string *)&memberCount,
                              (bool)(typeList1._7_1_ & 1));
      }
      typeList1._6_1_ = local_111;
    }
    index = index + 1;
  }
  do {
    sVar6 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::size
                      ((vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_> *)
                       newName.field_2._8_8_);
    if (sVar6 <= index) {
LAB_0064aeb2:
      std::__cxx11::string::~string((string *)&memberCount);
      return typeList1._6_1_;
    }
    pvVar7 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::at
                       ((vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_> *)
                        newName.field_2._8_8_,index);
    iVar4 = (*pvVar7->type->_vptr_TType[7])();
    if (iVar4 != 0) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8,
                     name,": struct mismatch.");
      pTVar1 = this->infoSink;
      pcVar9 = (char *)std::__cxx11::string::c_str();
      TInfoSinkBase::message(&pTVar1->info,EPrefixError,pcVar9);
      typeList1._6_1_ = true;
      std::__cxx11::string::~string((string *)local_d8);
      goto LAB_0064aeb2;
    }
    index = index + 1;
  } while( true );
}

Assistant:

bool typeCheck(const TType* const type1, const TType* const type2, const std::string& name, bool isBlock)
    {
        bool hasError = false;
        if (!(type1->isStruct() && type2->isStruct())) {
            hasError = hasError || qualifierCheck(type1, type2, name, isBlock);
        }
        else {
            if (type1->getBasicType() == EbtBlock && type2->getBasicType() == EbtBlock)
                isBlock = true;
            const TTypeList* typeList1 = type1->getStruct();
            const TTypeList* typeList2 = type2->getStruct();

            std::string newName = name;
            size_t memberCount = typeList1->size();
            size_t index2 = 0;
            for (size_t index = 0; index < memberCount; index++, index2++) {
                // Skip inactive member
                if (typeList1->at(index).type->getBasicType() == EbtVoid)
                    continue;
                while (index2 < typeList2->size() && typeList2->at(index2).type->getBasicType() == EbtVoid) {
                    ++index2;
                }

                // TypeList1 has more members in list
                if (index2 == typeList2->size()) {
                    std::string errorStr = name + ": struct mismatch.";
                    infoSink.info.message(EPrefixError, errorStr.c_str());
                    hasError = true;
                    break;
                }

                if (typeList1->at(index).type->getFieldName() != typeList2->at(index2).type->getFieldName()) {
                    std::string errorStr = name + ": member name mismatch.";
                    infoSink.info.message(EPrefixError, errorStr.c_str());
                    hasError = true;
                }
                else {
                    newName = typeList1->at(index).type->getFieldName().c_str();
                }
                hasError = hasError || typeCheck(typeList1->at(index).type, typeList2->at(index2).type, newName, isBlock);
            }

            while (index2 < typeList2->size())
            {
                // TypeList2 has more members
                if (typeList2->at(index2).type->getBasicType() != EbtVoid) {
                    std::string errorStr = name + ": struct mismatch.";
                    infoSink.info.message(EPrefixError, errorStr.c_str());
                    hasError = true;
                    break;
                }
                ++index2;
            }
        }
        return hasError;
    }